

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall tinyusdz::crate::CrateReader::ReadTokens(CrateReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  StreamReader *pSVar3;
  ulong uVar4;
  uint64_t uVar5;
  bool bVar6;
  ostream *poVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  pointer pcVar15;
  string *err;
  uchar *in_R9;
  ulong uVar16;
  size_t nbytes;
  size_t __n;
  token tok;
  uint64_t num_tokens;
  uint64_t compressedSize;
  uint64_t uncompressedSize;
  vector<char,_std::allocator<char>_> chars;
  ostringstream ss_e;
  vector<char,_std::allocator<char>_> compressed;
  string local_248;
  ulong local_228;
  string *local_220;
  ulong local_218;
  ulong local_210;
  string local_208;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *local_1e8;
  vector<char,_std::allocator<char>_> local_1e0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  ios_base local_158 [264];
  vector<char,_std::allocator<char>_> local_50;
  _Alloc_hider local_38;
  
  lVar10 = this->_tokens_index;
  if ((lVar10 < 0) ||
     (pSVar2 = (this->_toc).sections.
               super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(this->_toc).sections.
           super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>.
           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 5 <= lVar10)) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"ReadTokens",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x1549);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    pcVar14 = "Invalid index for `TOKENS` section.";
LAB_001d89f3:
    lVar10 = 0x23;
    goto LAB_001d89f8;
  }
  if ((this->_version[0] == '\0') && (this->_version[1] < 4)) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"ReadTokens",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x154e);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"Version must be 0.4.0 or later, but got {}.{}.{}","");
    fmt::format<unsigned_char,unsigned_char,unsigned_char>
              (&local_248,(fmt *)&local_208,(string *)this,this->_version + 1,this->_version + 2,
               in_R9);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1c8,local_248._M_dataplus._M_p,local_248._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                               local_248.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
LAB_001d8c94:
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
LAB_001d8ca1:
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_248._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p == &local_248.field_2) goto LAB_001d8a57;
  }
  else {
    pSVar3 = this->_sr;
    if (pSVar3->length_ < (ulong)pSVar2[lVar10].start) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"ReadTokens",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x1553);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      pcVar14 = "Failed to move to `TOKENS` section.";
      goto LAB_001d89f3;
    }
    pSVar3->idx_ = pSVar2[lVar10].start;
    if (pSVar2[lVar10].size < 4) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"ReadTokens",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x1558);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,"`TOKENS` section data size is zero or too small.","");
      fmt::format(&local_248,&local_208);
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1c8,local_248._M_dataplus._M_p,
                          local_248._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) goto LAB_001d8c94;
      goto LAB_001d8ca1;
    }
    bVar6 = StreamReader::read8(pSVar3,&local_228);
    if (bVar6) {
      if (local_228 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"ReadTokens",10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x1567);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        pcVar14 = "Empty tokens.";
        lVar10 = 0xd;
      }
      else if ((this->_config).maxNumTokens < local_228) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"ReadTokens",10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x156b);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        pcVar14 = "Too many Tokens.";
        lVar10 = 0x10;
      }
      else {
        bVar6 = StreamReader::read8(this->_sr,&local_210);
        if (bVar6) {
          if (local_210 < local_228 + 3) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1c8,"ReadTokens",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x157d);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            pcVar14 = "`TOKENS` section corrupted.";
            lVar10 = 0x1b;
          }
          else if (local_210 < 4) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1c8,"ReadTokens",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x1582);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            pcVar14 = "uncompressedSize too small or zero bytes.";
            lVar10 = 0x29;
          }
          else {
            bVar6 = StreamReader::read8(this->_sr,&local_218);
            if (bVar6) {
              if (local_218 < 4) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,"[Crate]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,"ReadTokens",10);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x158d);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                pcVar14 = "compressedSize is too small or zero bytes.";
                lVar10 = 0x2a;
              }
              else if (this->_sr->length_ < local_218) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,"[Crate]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,"ReadTokens",10);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x1591);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                pcVar14 = "Compressed data size exceeds input file size.";
                lVar10 = 0x2d;
              }
              else if ((ulong)pSVar2[lVar10].size < local_218) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,"[Crate]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1c8,"ReadTokens",10);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x1595);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                pcVar14 = "Compressed data size exceeds `TOKENS` section size.";
                lVar10 = 0x33;
              }
              else {
                uVar16 = local_218;
                if (local_218 <= local_210) {
                  uVar16 = local_210;
                }
                uVar8 = this->_memoryUsage + uVar16 + 0x80;
                this->_memoryUsage = uVar8;
                uVar4 = (this->_config).maxMemoryBudget;
                if (uVar4 < uVar8) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,"[Crate]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,"ReadTokens",10);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,"():",3);
                  iVar13 = 0x159d;
                }
                else {
                  this->_memoryUsage = uVar8 + local_210;
                  if (uVar8 + local_210 <= uVar4) {
                    ::std::vector<char,_std::allocator<char>_>::vector
                              (&local_1e0,local_210,(allocator_type *)&local_1c8);
                    memset(local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,0,
                           (long)local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
                    ::std::vector<char,_std::allocator<char>_>::vector
                              (&local_50,uVar16 + 0x80,(allocator_type *)&local_1c8);
                    memset(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,0,
                           (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
                    uVar16 = local_218;
                    pSVar3 = this->_sr;
                    uVar5 = pSVar3->idx_;
                    __n = pSVar3->length_ - uVar5;
                    if (uVar5 + local_218 <= pSVar3->length_) {
                      __n = local_218;
                    }
                    if (__n - 1 < local_218) {
                      memcpy(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,pSVar3->binary_ + uVar5,__n);
                      pSVar3->idx_ = pSVar3->idx_ + __n;
                    }
                    else {
                      __n = 0;
                    }
                    if (uVar16 == __n) {
                      err = &this->_err;
                      local_220 = err;
                      sVar9 = LZ4Compression::DecompressFromBuffer
                                        (local_50.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start,
                                         local_1e0.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start,local_218,
                                         local_210,err);
                      if (local_210 != sVar9) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_1c8,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_1c8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                   ,0x56);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_1c8,"[Crate]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_1c8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_1c8,"ReadTokens",10);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_1c8,"():",3);
                        poVar7 = (ostream *)
                                 ::std::ostream::operator<<((ostringstream *)&local_1c8,0x15b3);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_1c8,"Failed to decompress data of Tokens.",0x24
                                  );
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_1c8,"\n",1);
                        ::std::__cxx11::stringbuf::str();
                        ::std::__cxx11::string::_M_append
                                  ((char *)local_220,(ulong)local_248._M_dataplus._M_p);
                        goto LAB_001d9ac4;
                      }
                      if (local_228 == 0) {
                        local_228 = 0;
                      }
                      else {
                        lVar10 = (long)local_1e0.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_1e0.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
                        paVar1 = &local_248.field_2;
                        local_1e8 = &this->_tokens;
                        uVar16 = 0;
                        pcVar15 = local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        do {
                          if ((pcVar15 == (char *)0x0) || (lVar10 == 0)) {
                            pcVar14 = pcVar15 + 1;
                            if (local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish < pcVar14) goto LAB_001d9cd1;
LAB_001d9803:
                            local_1c8 = &local_1b8;
                            local_1b8 = 0;
                            local_1c0 = 0;
                            local_248._M_string_length = 0;
                            local_248.field_2._M_local_buf[0] = '\0';
                            pcVar15 = pcVar14;
                            local_248._M_dataplus._M_p = (pointer)paVar1;
                          }
                          else {
                            lVar11 = 0;
                            do {
                              lVar12 = lVar11;
                              if (pcVar15[lVar11] == '\0') break;
                              lVar11 = lVar11 + 1;
                              lVar12 = lVar10;
                            } while (lVar10 != lVar11);
                            pcVar14 = pcVar15 + lVar12 + 1;
                            if (local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish < pcVar14) {
LAB_001d9cd1:
                              ::std::__cxx11::string::append((char *)local_220);
                              goto LAB_001d9afc;
                            }
                            local_1c8 = &local_1b8;
                            local_1c0 = 0;
                            local_1b8 = 0;
                            if (lVar12 == 0) goto LAB_001d9803;
                            local_248._M_dataplus._M_p = (pointer)paVar1;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_248,pcVar15,pcVar15 + lVar12);
                            pcVar15 = pcVar14;
                          }
                          ::std::__cxx11::string::operator=
                                    ((string *)&local_1c8,(string *)&local_248);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_248._M_dataplus._M_p != paVar1) {
                            operator_delete(local_248._M_dataplus._M_p,
                                            CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                                     local_248.field_2._M_local_buf[0]) + 1);
                          }
                          local_248._M_string_length = 0;
                          local_248.field_2._M_local_buf[0] = '\0';
                          local_248._M_dataplus._M_p = (pointer)paVar1;
                          ::std::__cxx11::string::_M_assign((string *)&local_248);
                          ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                          push_back(local_1e8,(value_type *)&local_248);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_248._M_dataplus._M_p != paVar1) {
                            operator_delete(local_248._M_dataplus._M_p,
                                            CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                                     local_248.field_2._M_local_buf[0]) + 1);
                          }
                          if (local_1c8 != &local_1b8) {
                            operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
                          }
                          lVar10 = (long)local_1e0.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_finish - (long)pcVar15;
                        } while ((lVar10 != 0) && (uVar16 = uVar16 + 1, uVar16 < local_228));
                      }
                      bVar6 = true;
                      if ((long)(this->_tokens).
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_tokens).
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5 == local_228)
                      goto LAB_001d9afe;
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,"[Crate]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,"ReadTokens",10);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,"():",3);
                      poVar7 = (ostream *)
                               ::std::ostream::operator<<((ostringstream *)&local_1c8,0x15f2);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_208,
                                 "The number of tokens parsed {} does not match the requested one {}"
                                 ,"");
                      local_38._M_p =
                           (pointer)((long)(this->_tokens).
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->_tokens).
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 5);
                      fmt::format<unsigned_long,unsigned_long>
                                (&local_248,(fmt *)&local_208,(string *)&local_38,&local_228,
                                 (unsigned_long *)err);
                      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&local_1c8,local_248._M_dataplus._M_p,
                                          local_248._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_248._M_dataplus._M_p != &local_248.field_2) {
                        operator_delete(local_248._M_dataplus._M_p,
                                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                                 local_248.field_2._M_local_buf[0]) + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_208._M_dataplus._M_p != &local_208.field_2) {
                        operator_delete(local_208._M_dataplus._M_p,
                                        local_208.field_2._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::stringbuf::str();
                      ::std::__cxx11::string::_M_append
                                ((char *)local_220,(ulong)local_248._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_248._M_dataplus._M_p != &local_248.field_2) goto LAB_001d9ace;
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,"[Crate]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,"ReadTokens",10);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,"():",3);
                      poVar7 = (ostream *)
                               ::std::ostream::operator<<((ostringstream *)&local_1c8,0x15ab);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,
                                 "Failed to read compressed data at `TOKENS` section.",0x33);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_1c8,"\n",1);
                      ::std::__cxx11::stringbuf::str();
                      ::std::__cxx11::string::_M_append
                                ((char *)&this->_err,(ulong)local_248._M_dataplus._M_p);
LAB_001d9ac4:
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_248._M_dataplus._M_p != &local_248.field_2) {
LAB_001d9ace:
                        operator_delete(local_248._M_dataplus._M_p,
                                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                                 local_248.field_2._M_local_buf[0]) + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
                    ::std::ios_base::~ios_base(local_158);
LAB_001d9afc:
                    bVar6 = false;
LAB_001d9afe:
                    if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start != (char *)0x0) {
                      operator_delete(local_50.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_50.super__Vector_base<char,_std::allocator<char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_50.super__Vector_base<char,_std::allocator<char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_1e0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start == (char *)0x0) {
                      return bVar6;
                    }
                    operator_delete(local_1e0.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_1e0.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_1e0.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                    return bVar6;
                  }
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,"[Crate]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,"ReadTokens",10);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1c8,"():",3);
                  iVar13 = 0x159e;
                }
                poVar7 = (ostream *)::std::ostream::operator<<(&local_1c8,iVar13);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                pcVar14 = "Reached to max memory budget.";
                lVar10 = 0x1d;
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1c8,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1c8,"[Crate]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1c8,"ReadTokens",10);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x1587);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              pcVar14 = "Failed to read compressedSize at `TOKENS` section.";
              lVar10 = 0x32;
            }
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1c8,"ReadTokens",10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x1573);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          pcVar14 = "Failed to read uncompressedSize at `TOKENS` section.";
          lVar10 = 0x34;
        }
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"ReadTokens",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1c8,0x1561);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      pcVar14 = "Failed to read # of tokens at `TOKENS` section.";
      lVar10 = 0x2f;
    }
LAB_001d89f8:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,pcVar14,lVar10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_248._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p == &local_248.field_2) goto LAB_001d8a57;
  }
  operator_delete(local_248._M_dataplus._M_p,
                  CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                           local_248.field_2._M_local_buf[0]) + 1);
LAB_001d8a57:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
  ::std::ios_base::~ios_base(local_158);
  return false;
}

Assistant:

bool CrateReader::ReadTokens() {
  if ((_tokens_index < 0) || (_tokens_index >= int64_t(_toc.sections.size()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid index for `TOKENS` section.");
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Version must be 0.4.0 or later, but got {}.{}.{}",
      _version[0], _version[1], _version[2]));
  }

  const crate::Section &sec = _toc.sections[size_t(_tokens_index)];
  if (!_sr->seek_set(uint64_t(sec.start))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to move to `TOKENS` section.");
    return false;
  }

  if (sec.size < 4) {
     PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("`TOKENS` section data size is zero or too small."));
  }

  DCOUT("sec.start = " << sec.start);
  DCOUT("sec.size = " << sec.size);

  // # of tokens.
  uint64_t num_tokens;
  if (!_sr->read8(&num_tokens)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read # of tokens at `TOKENS` section.");
  }

  DCOUT("# of tokens = " << num_tokens);

  if (num_tokens == 0) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Empty tokens.");
  }

  if (num_tokens > _config.maxNumTokens) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many Tokens.");
  }

  // Tokens are lz4 compressed starting from version 0.4.0

  // Compressed token data.
  uint64_t uncompressedSize;
  if (!_sr->read8(&uncompressedSize)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read uncompressedSize at `TOKENS` section.");
  }

  DCOUT("uncompressedSize = " << uncompressedSize);


  // Must be larger than len(';-)') + all empty string case.
  // 3 = ';-)'
  // num_tokens = '\0' delimiter
  if ((3 + num_tokens) > uncompressedSize) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "`TOKENS` section corrupted.");
  }

  // At least min size should be 16 both for compress and uncompress.
  if (uncompressedSize < 4) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "uncompressedSize too small or zero bytes.");
  }

  uint64_t compressedSize;
  if (!_sr->read8(&compressedSize)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read compressedSize at `TOKENS` section.");
  }

  DCOUT("compressedSize = " << compressedSize);

  if (compressedSize < 4) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "compressedSize is too small or zero bytes.");
  }

  if (compressedSize > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Compressed data size exceeds input file size.");
  }

  if (size_t(compressedSize) > size_t(sec.size)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Compressed data size exceeds `TOKENS` section size.");
  }

  // To combat with heap-buffer flow in lz4 cuased by corrupted lz4 compressed data,
  // We allocate same size of uncompressedSize(or larger one),
  // And further, extra 128 bytes for safety(LZ4_FAST_DEC_LOOP does 16 bytes stride memcpy)

  uint64_t bufSize = (std::max)(compressedSize, uncompressedSize);
  CHECK_MEMORY_USAGE(bufSize+128);
  CHECK_MEMORY_USAGE(uncompressedSize);


  // dst
  std::vector<char> chars(static_cast<size_t>(uncompressedSize));
  memset(chars.data(), 0, chars.size());

  std::vector<char> compressed(static_cast<size_t>(bufSize + 128));
  memset(compressed.data(), 0, compressed.size());

  if (compressedSize !=
      _sr->read(size_t(compressedSize), size_t(compressedSize),
                reinterpret_cast<uint8_t *>(compressed.data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read compressed data at `TOKENS` section.");
    return false;
  }

  if (uncompressedSize !=
      LZ4Compression::DecompressFromBuffer(compressed.data(), chars.data(),
                                           size_t(compressedSize),
                                           size_t(uncompressedSize), &_err)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to decompress data of Tokens.");
  }

  // Split null terminated string into _tokens.
  const char *ps = chars.data();
  const char *pe = chars.data() + chars.size();
  const char *pcurr = ps;
  size_t nbytes_remain = size_t(chars.size());

  auto my_strnlen = [](const char *s, const size_t max_length) -> size_t {
    if (!s) return 0;

    size_t i = 0;
    for (; i < max_length; i++) {
      if (s[i] == '\0') {
        return i;
      }
    }

    // null character not found.
    return i;
  };

  // TODO(syoyo): Check if input string has exactly `n` tokens(`n` null
  // characters)
  for (size_t i = 0; i < num_tokens; i++) {
    DCOUT("n_remain = " << nbytes_remain);

    size_t len = my_strnlen(pcurr, nbytes_remain);
    DCOUT("len = " << len);

    if ((pcurr + (len+1)) > pe) {
      _err += "Invalid token string array.\n";
      return false;
    }

    std::string str;
    if (len > 0) {
      str = std::string(pcurr, len);
    } else {
      // Empty string allowed
      str = std::string();
    }

    pcurr += len + 1;  // +1 = '\0'
    nbytes_remain = size_t(pe - pcurr);
    if (pcurr > pe) {
      _err += "Invalid token string array.\n";
      return false;
    }

    value::token tok(str);

    DCOUT("token[" << i << "] = " << tok);
    _tokens.push_back(tok);

    if (nbytes_remain == 0) {
      // reached to the string buffer end.
      break;
    }
  }

  if (_tokens.size() != num_tokens) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("The number of tokens parsed {} does not match the requested one {}", _tokens.size(), num_tokens));
  }

  return true;
}